

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.hpp
# Opt level: O1

ostream_base * __thiscall
pstore::exchange::export_ns::ostream_base::write<unsigned_long,void>
          (ostream_base *this,unsigned_long v)

{
  ostream_base *poVar1;
  span<const_char,__1L> s;
  pair<const_char_*,_const_char_*> pVar2;
  base10storage<unsigned_long> str;
  not_null<std::array<char,_20UL>_*> local_50;
  extent_type<_1L> local_48 [2];
  array<char,_20UL> local_38;
  
  local_50.ptr_ = &local_38;
  local_38._M_elems[0] = '\0';
  local_38._M_elems[1] = '\0';
  local_38._M_elems[2] = '\0';
  local_38._M_elems[3] = '\0';
  local_38._M_elems[4] = '\0';
  local_38._M_elems[5] = '\0';
  local_38._M_elems[6] = '\0';
  local_38._M_elems[7] = '\0';
  local_38._M_elems[8] = '\0';
  local_38._M_elems[9] = '\0';
  local_38._M_elems[10] = '\0';
  local_38._M_elems[0xb] = '\0';
  local_38._M_elems[0xc] = '\0';
  local_38._M_elems[0xd] = '\0';
  local_38._M_elems[0xe] = '\0';
  local_38._M_elems[0xf] = '\0';
  local_38._M_elems[0x10] = '\0';
  local_38._M_elems[0x11] = '\0';
  local_38._M_elems[0x12] = '\0';
  local_38._M_elems[0x13] = '\0';
  gsl::not_null<std::array<char,_20UL>_*>::ensure_invariant(&local_50);
  pVar2 = details::to_characters<unsigned_long,_void>(v,local_50);
  gsl::details::extent_type<-1L>::extent_type(local_48,(long)pVar2.second - (long)pVar2.first);
  s.storage_.data_ = pVar2.first;
  s.storage_.super_extent_type<_1L>.size_ = local_48[0].size_;
  poVar1 = write<_1l>(this,s);
  return poVar1;
}

Assistant:

ostream_base & write (Unsigned const v) {
                    details::base10storage<Unsigned> str{{}};
                    auto res = details::to_characters (v, &str);
                    return this->write (gsl::make_span (res.first, res.second));
                }